

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O2

int Load_ARB_multitexture(void)

{
  _func_void_GLenum_GLdouble *p_Var1;
  _func_void_GLenum_GLdouble_ptr *p_Var2;
  _func_void_GLenum_GLfloat *p_Var3;
  _func_void_GLenum_GLfloat_ptr *p_Var4;
  _func_void_GLenum_GLint *p_Var5;
  _func_void_GLenum_GLint_ptr *p_Var6;
  _func_void_GLenum_GLshort *p_Var7;
  _func_void_GLenum_GLshort_ptr *p_Var8;
  _func_void_GLenum_GLdouble_GLdouble *p_Var9;
  _func_void_GLenum_GLdouble_ptr *p_Var10;
  _func_void_GLenum_GLfloat_GLfloat *p_Var11;
  _func_void_GLenum_GLfloat_ptr *p_Var12;
  _func_void_GLenum_GLint_GLint *p_Var13;
  _func_void_GLenum_GLint_ptr *p_Var14;
  _func_void_GLenum_GLshort_GLshort *p_Var15;
  _func_void_GLenum_GLshort_ptr *p_Var16;
  _func_void_GLenum_GLdouble_GLdouble_GLdouble *p_Var17;
  _func_void_GLenum_GLdouble_ptr *p_Var18;
  _func_void_GLenum_GLfloat_GLfloat_GLfloat *p_Var19;
  _func_void_GLenum_GLfloat_ptr *p_Var20;
  _func_void_GLenum_GLint_GLint_GLint *p_Var21;
  _func_void_GLenum_GLint_ptr *p_Var22;
  _func_void_GLenum_GLshort_GLshort_GLshort *p_Var23;
  _func_void_GLenum_GLshort_ptr *p_Var24;
  _func_void_GLenum_GLdouble_GLdouble_GLdouble_GLdouble *p_Var25;
  _func_void_GLenum_GLdouble_ptr *p_Var26;
  _func_void_GLenum_GLfloat_GLfloat_GLfloat_GLfloat *p_Var27;
  _func_void_GLenum_GLfloat_ptr *p_Var28;
  _func_void_GLenum_GLint_GLint_GLint_GLint *p_Var29;
  _func_void_GLenum_GLint_ptr *p_Var30;
  _func_void_GLenum_GLshort_GLshort_GLshort_GLshort *p_Var31;
  uint uVar32;
  uint uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  
  sf_ptrc_glActiveTextureARB = (_func_void_GLenum *)sf::Context::getFunction("glActiveTextureARB");
  bVar34 = sf_ptrc_glActiveTextureARB == (_func_void_GLenum *)0x0;
  sf_ptrc_glClientActiveTextureARB =
       (_func_void_GLenum *)sf::Context::getFunction("glClientActiveTextureARB");
  uVar32 = bVar34 + 1;
  if (sf_ptrc_glClientActiveTextureARB != (_func_void_GLenum *)0x0) {
    uVar32 = (uint)bVar34;
  }
  p_Var1 = (_func_void_GLenum_GLdouble *)sf::Context::getFunction("glMultiTexCoord1dARB");
  sf_ptrc_glMultiTexCoord1dARB = p_Var1;
  p_Var2 = (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord1dvARB");
  sf_ptrc_glMultiTexCoord1dvARB = p_Var2;
  p_Var3 = (_func_void_GLenum_GLfloat *)sf::Context::getFunction("glMultiTexCoord1fARB");
  sf_ptrc_glMultiTexCoord1fARB = p_Var3;
  p_Var4 = (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord1fvARB");
  sf_ptrc_glMultiTexCoord1fvARB = p_Var4;
  p_Var5 = (_func_void_GLenum_GLint *)sf::Context::getFunction("glMultiTexCoord1iARB");
  sf_ptrc_glMultiTexCoord1iARB = p_Var5;
  p_Var6 = (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord1ivARB");
  sf_ptrc_glMultiTexCoord1ivARB = p_Var6;
  p_Var7 = (_func_void_GLenum_GLshort *)sf::Context::getFunction("glMultiTexCoord1sARB");
  sf_ptrc_glMultiTexCoord1sARB = p_Var7;
  p_Var8 = (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord1svARB");
  sf_ptrc_glMultiTexCoord1svARB = p_Var8;
  p_Var9 = (_func_void_GLenum_GLdouble_GLdouble *)sf::Context::getFunction("glMultiTexCoord2dARB");
  sf_ptrc_glMultiTexCoord2dARB = p_Var9;
  p_Var10 = (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord2dvARB");
  sf_ptrc_glMultiTexCoord2dvARB = p_Var10;
  p_Var11 = (_func_void_GLenum_GLfloat_GLfloat *)sf::Context::getFunction("glMultiTexCoord2fARB");
  sf_ptrc_glMultiTexCoord2fARB = p_Var11;
  p_Var12 = (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord2fvARB");
  sf_ptrc_glMultiTexCoord2fvARB = p_Var12;
  p_Var13 = (_func_void_GLenum_GLint_GLint *)sf::Context::getFunction("glMultiTexCoord2iARB");
  sf_ptrc_glMultiTexCoord2iARB = p_Var13;
  p_Var14 = (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord2ivARB");
  sf_ptrc_glMultiTexCoord2ivARB = p_Var14;
  p_Var15 = (_func_void_GLenum_GLshort_GLshort *)sf::Context::getFunction("glMultiTexCoord2sARB");
  sf_ptrc_glMultiTexCoord2sARB = p_Var15;
  p_Var16 = (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord2svARB");
  sf_ptrc_glMultiTexCoord2svARB = p_Var16;
  p_Var17 = (_func_void_GLenum_GLdouble_GLdouble_GLdouble *)
            sf::Context::getFunction("glMultiTexCoord3dARB");
  sf_ptrc_glMultiTexCoord3dARB = p_Var17;
  p_Var18 = (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord3dvARB");
  sf_ptrc_glMultiTexCoord3dvARB = p_Var18;
  p_Var19 = (_func_void_GLenum_GLfloat_GLfloat_GLfloat *)
            sf::Context::getFunction("glMultiTexCoord3fARB");
  sf_ptrc_glMultiTexCoord3fARB = p_Var19;
  p_Var20 = (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord3fvARB");
  sf_ptrc_glMultiTexCoord3fvARB = p_Var20;
  p_Var21 = (_func_void_GLenum_GLint_GLint_GLint *)sf::Context::getFunction("glMultiTexCoord3iARB");
  sf_ptrc_glMultiTexCoord3iARB = p_Var21;
  p_Var22 = (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord3ivARB");
  sf_ptrc_glMultiTexCoord3ivARB = p_Var22;
  p_Var23 = (_func_void_GLenum_GLshort_GLshort_GLshort *)
            sf::Context::getFunction("glMultiTexCoord3sARB");
  sf_ptrc_glMultiTexCoord3sARB = p_Var23;
  p_Var24 = (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord3svARB");
  sf_ptrc_glMultiTexCoord3svARB = p_Var24;
  p_Var25 = (_func_void_GLenum_GLdouble_GLdouble_GLdouble_GLdouble *)
            sf::Context::getFunction("glMultiTexCoord4dARB");
  sf_ptrc_glMultiTexCoord4dARB = p_Var25;
  p_Var26 = (_func_void_GLenum_GLdouble_ptr *)sf::Context::getFunction("glMultiTexCoord4dvARB");
  sf_ptrc_glMultiTexCoord4dvARB = p_Var26;
  p_Var27 = (_func_void_GLenum_GLfloat_GLfloat_GLfloat_GLfloat *)
            sf::Context::getFunction("glMultiTexCoord4fARB");
  sf_ptrc_glMultiTexCoord4fARB = p_Var27;
  p_Var28 = (_func_void_GLenum_GLfloat_ptr *)sf::Context::getFunction("glMultiTexCoord4fvARB");
  sf_ptrc_glMultiTexCoord4fvARB = p_Var28;
  p_Var29 = (_func_void_GLenum_GLint_GLint_GLint_GLint *)
            sf::Context::getFunction("glMultiTexCoord4iARB");
  sf_ptrc_glMultiTexCoord4iARB = p_Var29;
  p_Var30 = (_func_void_GLenum_GLint_ptr *)sf::Context::getFunction("glMultiTexCoord4ivARB");
  sf_ptrc_glMultiTexCoord4ivARB = p_Var30;
  p_Var31 = (_func_void_GLenum_GLshort_GLshort_GLshort_GLshort *)
            sf::Context::getFunction("glMultiTexCoord4sARB");
  sf_ptrc_glMultiTexCoord4sARB = p_Var31;
  sf_ptrc_glMultiTexCoord4svARB =
       (_func_void_GLenum_GLshort_ptr *)sf::Context::getFunction("glMultiTexCoord4svARB");
  auVar35._0_4_ = -(uint)((int)p_Var1 == 0);
  auVar35._4_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0);
  auVar35._8_4_ = -(uint)((int)p_Var2 == 0);
  auVar35._12_4_ = -(uint)((int)((ulong)p_Var2 >> 0x20) == 0);
  auVar61._4_4_ = auVar35._0_4_;
  auVar61._0_4_ = auVar35._4_4_;
  auVar61._8_4_ = auVar35._12_4_;
  auVar61._12_4_ = auVar35._8_4_;
  auVar66._0_4_ = -(uint)((int)p_Var3 == 0);
  auVar66._4_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0);
  auVar66._8_4_ = -(uint)((int)p_Var4 == 0);
  auVar66._12_4_ = -(uint)((int)((ulong)p_Var4 >> 0x20) == 0);
  auVar62._4_4_ = auVar66._0_4_;
  auVar62._0_4_ = auVar66._4_4_;
  auVar62._8_4_ = auVar66._12_4_;
  auVar62._12_4_ = auVar66._8_4_;
  auVar62 = packssdw(auVar61 & auVar35,auVar62 & auVar66);
  auVar39._0_4_ = -(uint)((int)p_Var5 == 0);
  auVar39._4_4_ = -(uint)((int)((ulong)p_Var5 >> 0x20) == 0);
  auVar39._8_4_ = -(uint)((int)p_Var6 == 0);
  auVar39._12_4_ = -(uint)((int)((ulong)p_Var6 >> 0x20) == 0);
  auVar63._4_4_ = auVar39._0_4_;
  auVar63._0_4_ = auVar39._4_4_;
  auVar63._8_4_ = auVar39._12_4_;
  auVar63._12_4_ = auVar39._8_4_;
  auVar65._0_4_ = -(uint)((int)p_Var7 == 0);
  auVar65._4_4_ = -(uint)((int)((ulong)p_Var7 >> 0x20) == 0);
  auVar65._8_4_ = -(uint)((int)p_Var8 == 0);
  auVar65._12_4_ = -(uint)((int)((ulong)p_Var8 >> 0x20) == 0);
  auVar40._4_4_ = auVar65._0_4_;
  auVar40._0_4_ = auVar65._4_4_;
  auVar40._8_4_ = auVar65._12_4_;
  auVar40._12_4_ = auVar65._8_4_;
  auVar35 = packssdw(auVar63 & auVar39,auVar40 & auVar65);
  auVar63 = packssdw(auVar62,auVar35);
  auVar60._0_4_ = -(uint)((int)p_Var9 == 0);
  auVar60._4_4_ = -(uint)((int)((ulong)p_Var9 >> 0x20) == 0);
  auVar60._8_4_ = -(uint)((int)p_Var10 == 0);
  auVar60._12_4_ = -(uint)((int)((ulong)p_Var10 >> 0x20) == 0);
  auVar64._4_4_ = auVar60._0_4_;
  auVar64._0_4_ = auVar60._4_4_;
  auVar64._8_4_ = auVar60._12_4_;
  auVar64._12_4_ = auVar60._8_4_;
  auVar59._0_4_ = -(uint)((int)p_Var11 == 0);
  auVar59._4_4_ = -(uint)((int)((ulong)p_Var11 >> 0x20) == 0);
  auVar59._8_4_ = -(uint)((int)p_Var12 == 0);
  auVar59._12_4_ = -(uint)((int)((ulong)p_Var12 >> 0x20) == 0);
  auVar41._4_4_ = auVar59._0_4_;
  auVar41._0_4_ = auVar59._4_4_;
  auVar41._8_4_ = auVar59._12_4_;
  auVar41._12_4_ = auVar59._8_4_;
  auVar35 = packssdw(auVar64 & auVar60,auVar41 & auVar59);
  auVar57._0_4_ = -(uint)((int)p_Var13 == 0);
  auVar57._4_4_ = -(uint)((int)((ulong)p_Var13 >> 0x20) == 0);
  auVar57._8_4_ = -(uint)((int)p_Var14 == 0);
  auVar57._12_4_ = -(uint)((int)((ulong)p_Var14 >> 0x20) == 0);
  auVar42._4_4_ = auVar57._0_4_;
  auVar42._0_4_ = auVar57._4_4_;
  auVar42._8_4_ = auVar57._12_4_;
  auVar42._12_4_ = auVar57._8_4_;
  auVar55._0_4_ = -(uint)((int)p_Var15 == 0);
  auVar55._4_4_ = -(uint)((int)((ulong)p_Var15 >> 0x20) == 0);
  auVar55._8_4_ = -(uint)((int)p_Var16 == 0);
  auVar55._12_4_ = -(uint)((int)((ulong)p_Var16 >> 0x20) == 0);
  auVar58._4_4_ = auVar55._0_4_;
  auVar58._0_4_ = auVar55._4_4_;
  auVar58._8_4_ = auVar55._12_4_;
  auVar58._12_4_ = auVar55._8_4_;
  auVar62 = packssdw(auVar42 & auVar57,auVar58 & auVar55);
  auVar35 = packssdw(auVar35,auVar62);
  auVar64 = packsswb(auVar63,auVar35);
  auVar54._0_4_ = -(uint)((int)p_Var17 == 0);
  auVar54._4_4_ = -(uint)((int)((ulong)p_Var17 >> 0x20) == 0);
  auVar54._8_4_ = -(uint)((int)p_Var18 == 0);
  auVar54._12_4_ = -(uint)((int)((ulong)p_Var18 >> 0x20) == 0);
  auVar56._4_4_ = auVar54._0_4_;
  auVar56._0_4_ = auVar54._4_4_;
  auVar56._8_4_ = auVar54._12_4_;
  auVar56._12_4_ = auVar54._8_4_;
  auVar53._0_4_ = -(uint)((int)p_Var19 == 0);
  auVar53._4_4_ = -(uint)((int)((ulong)p_Var19 >> 0x20) == 0);
  auVar53._8_4_ = -(uint)((int)p_Var20 == 0);
  auVar53._12_4_ = -(uint)((int)((ulong)p_Var20 >> 0x20) == 0);
  auVar36._4_4_ = auVar53._0_4_;
  auVar36._0_4_ = auVar53._4_4_;
  auVar36._8_4_ = auVar53._12_4_;
  auVar36._12_4_ = auVar53._8_4_;
  auVar62 = packssdw(auVar56 & auVar54,auVar36 & auVar53);
  auVar52._0_4_ = -(uint)((int)p_Var21 == 0);
  auVar52._4_4_ = -(uint)((int)((ulong)p_Var21 >> 0x20) == 0);
  auVar52._8_4_ = -(uint)((int)p_Var22 == 0);
  auVar52._12_4_ = -(uint)((int)((ulong)p_Var22 >> 0x20) == 0);
  auVar37._4_4_ = auVar52._0_4_;
  auVar37._0_4_ = auVar52._4_4_;
  auVar37._8_4_ = auVar52._12_4_;
  auVar37._12_4_ = auVar52._8_4_;
  auVar51._0_4_ = -(uint)((int)p_Var23 == 0);
  auVar51._4_4_ = -(uint)((int)((ulong)p_Var23 >> 0x20) == 0);
  auVar51._8_4_ = -(uint)((int)p_Var24 == 0);
  auVar51._12_4_ = -(uint)((int)((ulong)p_Var24 >> 0x20) == 0);
  auVar43._4_4_ = auVar51._0_4_;
  auVar43._0_4_ = auVar51._4_4_;
  auVar43._8_4_ = auVar51._12_4_;
  auVar43._12_4_ = auVar51._8_4_;
  auVar35 = packssdw(auVar37 & auVar52,auVar43 & auVar51);
  auVar63 = packssdw(auVar62,auVar35);
  auVar49._0_4_ = -(uint)((int)p_Var25 == 0);
  auVar49._4_4_ = -(uint)((int)((ulong)p_Var25 >> 0x20) == 0);
  auVar49._8_4_ = -(uint)((int)p_Var26 == 0);
  auVar49._12_4_ = -(uint)((int)((ulong)p_Var26 >> 0x20) == 0);
  auVar38._4_4_ = auVar49._0_4_;
  auVar38._0_4_ = auVar49._4_4_;
  auVar38._8_4_ = auVar49._12_4_;
  auVar38._12_4_ = auVar49._8_4_;
  auVar46._0_4_ = -(uint)((int)p_Var27 == 0);
  auVar46._4_4_ = -(uint)((int)((ulong)p_Var27 >> 0x20) == 0);
  auVar46._8_4_ = -(uint)((int)p_Var28 == 0);
  auVar46._12_4_ = -(uint)((int)((ulong)p_Var28 >> 0x20) == 0);
  auVar44._4_4_ = auVar46._0_4_;
  auVar44._0_4_ = auVar46._4_4_;
  auVar44._8_4_ = auVar46._12_4_;
  auVar44._12_4_ = auVar46._8_4_;
  auVar35 = packssdw(auVar38 & auVar49,auVar44 & auVar46);
  local_f8 = (int)p_Var29;
  iStack_f4 = (int)((ulong)p_Var29 >> 0x20);
  iStack_f0 = (int)p_Var30;
  iStack_ec = (int)((ulong)p_Var30 >> 0x20);
  auVar47._0_4_ = -(uint)(local_f8 == 0);
  auVar47._4_4_ = -(uint)(iStack_f4 == 0);
  auVar47._8_4_ = -(uint)(iStack_f0 == 0);
  auVar47._12_4_ = -(uint)(iStack_ec == 0);
  auVar45._4_4_ = auVar47._0_4_;
  auVar45._0_4_ = auVar47._4_4_;
  auVar45._8_4_ = auVar47._12_4_;
  auVar45._12_4_ = auVar47._8_4_;
  local_108 = (int)p_Var31;
  iStack_104 = (int)((ulong)p_Var31 >> 0x20);
  iStack_100 = (int)sf_ptrc_glMultiTexCoord4svARB;
  iStack_fc = (int)((ulong)sf_ptrc_glMultiTexCoord4svARB >> 0x20);
  auVar50._0_4_ = -(uint)(local_108 == 0);
  auVar50._4_4_ = -(uint)(iStack_104 == 0);
  auVar50._8_4_ = -(uint)(iStack_100 == 0);
  auVar50._12_4_ = -(uint)(iStack_fc == 0);
  auVar48._4_4_ = auVar50._0_4_;
  auVar48._0_4_ = auVar50._4_4_;
  auVar48._8_4_ = auVar50._12_4_;
  auVar48._12_4_ = auVar50._8_4_;
  auVar62 = packssdw(auVar45 & auVar47,auVar48 & auVar50);
  auVar35 = packssdw(auVar35,auVar62);
  auVar35 = packsswb(auVar63,auVar35);
  uVar33 = CONCAT22((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar35[0xf] >> 7) << 0xf,
                    (ushort)(SUB161(auVar64 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar64[0xf] >> 7) << 0xf);
  uVar33 = uVar33 - (uVar33 >> 1 & 0x55555555);
  uVar33 = (uVar33 >> 2 & 0x33333333) + (uVar33 & 0x33333333);
  return (((uVar33 >> 4) + uVar33 & 0xf0f0f0f) * 0x1010101 >> 0x18) + uVar32;
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}